

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O2

Status __thiscall leveldb::TestWritableFile::Append(TestWritableFile *this,Slice *data)

{
  bool bVar1;
  long in_RDX;
  
  (**(code **)(*(long *)data[4].data_ + 0x10))();
  if ((this->super_WritableFile)._vptr_WritableFile == (_func_int **)0x0) {
    bVar1 = FaultInjectionTestEnv::IsFilesystemActive((FaultInjectionTestEnv *)data[5].data_);
    if (bVar1) {
      data[2].size_ = data[2].size_ + *(long *)(in_RDX + 8);
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status TestWritableFile::Append(const Slice& data) {
  Status s = target_->Append(data);
  if (s.ok() && env_->IsFilesystemActive()) {
    state_.pos_ += data.size();
  }
  return s;
}